

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerformImplementation.hpp
# Opt level: O3

void InstructionSet::M68k::Primitive::add_sub<true,false,unsigned_short>
               (unsigned_short source,unsigned_short *destination,Status *status)

{
  ushort uVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  ushort uVar4;
  uint uVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [16];
  
  uVar1 = *destination;
  uVar4 = uVar1 + source;
  status->carry_flag = (ulong)CARRY2(uVar1,source);
  status->extend_flag = (ulong)CARRY2(uVar1,source);
  status->zero_result = (ulong)uVar4;
  auVar6._8_6_ = 0;
  auVar6._0_8_ = (ulong)(~(uVar1 ^ source) & 0x8000) | 0x80000000;
  auVar6 = auVar6 & ZEXT414(CONCAT22(uVar4,uVar4 ^ uVar1));
  uVar5 = auVar6._0_4_;
  auVar2._4_2_ = auVar6._2_2_;
  auVar2._0_4_ = uVar5;
  auVar2._6_8_ = SUB148(ZEXT214(0) << 0x40,6);
  auVar3._4_10_ = auVar2._4_10_;
  auVar3._0_4_ = uVar5 & 0xffff;
  auVar7._0_8_ = auVar3._0_8_ & 0xffffffff;
  auVar7._8_4_ = auVar2._4_4_;
  auVar7._12_4_ = 0;
  status->overflow_flag = auVar7._0_8_;
  status->negative_flag = auVar7._8_8_;
  *destination = uVar4;
  return;
}

Assistant:

static void add_sub(IntT source, IntT &destination, Status &status) {
	static_assert(!std::numeric_limits<IntT>::is_signed);

	IntT result = is_add ?
		destination + source :
		destination - source;
	status.carry_flag = is_add ? result < destination : result > destination;

	// If this is an extend operation, there's a second opportunity to create carry,
	// which requires a second test.
	if(is_extend && status.extend_flag) {
		if constexpr (is_add) {
			++result;
			status.carry_flag |= result == 0;
		} else {
			status.carry_flag |= result == 0;
			--result;
		}
	}
	status.extend_flag = status.carry_flag;

	// Extend operations can reset the zero flag only; non-extend operations
	// can either set it or reset it. Which in the reverse-logic world of
	// zero_result means ORing or storing.
	if constexpr (is_extend) {
		status.zero_result |= Status::FlagT(result);
	} else {
		status.zero_result = Status::FlagT(result);
	}
	status.set_negative(result);
	status.overflow_flag = Numeric::overflow<is_add>(destination, source, result);
	destination = result;
}